

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

char * BuildModuleFromSource
                 (Allocator *allocator,char *modulePath,char *moduleRoot,char *code,uint codeSize,
                 char **errorPos,char *errorBuf,uint errorBufSize,int optimizationLevel,
                 ArrayView<InplaceStr> activeImports,CompilerStatistics *statistics)

{
  _func_char_ptr_Allocator_ptr_InplaceStr_char_ptr_bool_char_ptr_ptr_char_ptr_uint_int_ArrayView<InplaceStr>_CompilerStatistics_ptr
  **this;
  Lexer *bytecode_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  char *pcVar5;
  Lexeme *pLVar6;
  ArrayView<InplaceStr> activeImports_00;
  Lexeme *e;
  Lexeme *c;
  char *newStart;
  Lexer *lexer;
  char *bytecode;
  InplaceStr *pIStack_a8c8;
  uint currLen;
  uint uStack_a8c0;
  undefined4 uStack_a8bc;
  undefined1 local_a8b0 [8];
  CompilerContext ctx;
  TraceScope traceScope;
  char **errorPos_local;
  uint codeSize_local;
  char *code_local;
  char *moduleRoot_local;
  char *modulePath_local;
  Allocator *allocator_local;
  
  if ((BuildModuleFromSource(Allocator*,char_const*,char_const*,char_const*,unsigned_int,char_const**,char*,unsigned_int,int,ArrayView<InplaceStr>,CompilerStatistics*)
       ::token == '\0') &&
     (iVar2 = __cxa_guard_acquire(&BuildModuleFromSource(Allocator*,char_const*,char_const*,char_const*,unsigned_int,char_const**,char*,unsigned_int,int,ArrayView<InplaceStr>,CompilerStatistics*)
                                   ::token), iVar2 != 0)) {
    BuildModuleFromSource::token = NULLC::TraceGetToken("compiler","BuildModuleFromSource");
    __cxa_guard_release(&BuildModuleFromSource(Allocator*,char_const*,char_const*,char_const*,unsigned_int,char_const**,char*,unsigned_int,int,ArrayView<InplaceStr>,CompilerStatistics*)
                         ::token);
  }
  NULLC::TraceScope::TraceScope
            ((TraceScope *)&ctx.statistics.timers.allocator,BuildModuleFromSource::token);
  NULLC::TraceLabel(modulePath);
  pIStack_a8c8 = activeImports.data;
  uStack_a8c0 = activeImports.count;
  uStack_a8bc = activeImports._12_4_;
  activeImports_00._12_4_ = 0;
  activeImports_00.data = activeImports.data;
  activeImports_00.count = activeImports.count;
  CompilerContext::CompilerContext
            ((CompilerContext *)local_a8b0,allocator,optimizationLevel,activeImports_00);
  ctx.errorPos = errorBuf;
  ctx.errorBuf._0_4_ = errorBufSize;
  ctx.allocator = (Allocator *)code;
  ctx.code = moduleRoot;
  bVar1 = CompileModuleFromSource((CompilerContext *)local_a8b0);
  if (bVar1) {
    uVar3 = NULLCTime::clockMicro();
    CompilerStatistics::Start((CompilerStatistics *)&ctx.enableLogFiles,uVar3);
    lexer = (Lexer *)0x0;
    GetBytecode((CompilerContext *)local_a8b0,(char **)&lexer);
    uVar3 = NULLCTime::clockMicro();
    CompilerStatistics::Finish((CompilerStatistics *)&ctx.enableLogFiles,"Bytecode",uVar3);
    uVar3 = NULLCTime::clockMicro();
    CompilerStatistics::Start((CompilerStatistics *)&ctx.enableLogFiles,uVar3);
    this = &ctx.parseCtx.bytecodeBuilder;
    pcVar5 = FindSource((ByteCode *)lexer);
    e = Lexer::GetStreamStart((Lexer *)this);
    pLVar6 = Lexer::GetStreamStart((Lexer *)this);
    uVar3 = Lexer::GetStreamSize((Lexer *)this);
    bytecode_00 = lexer;
    for (; ((e != pLVar6 + uVar3 && (code <= e->pos)) && (e->pos <= code + codeSize)); e = e + 1) {
      e->pos = pcVar5 + ((long)e->pos - (long)code);
    }
    pLVar6 = Lexer::GetStreamStart((Lexer *)this);
    uVar3 = Lexer::GetStreamSize((Lexer *)this);
    BinaryCache::PutBytecode(modulePath,(char *)bytecode_00,pLVar6,uVar3);
    uVar3 = NULLCTime::clockMicro();
    CompilerStatistics::Finish((CompilerStatistics *)&ctx.enableLogFiles,"BytecodeCache",uVar3);
    if (statistics != (CompilerStatistics *)0x0) {
      CompilerStatistics::Add(statistics,(CompilerStatistics *)&ctx.enableLogFiles);
    }
    allocator_local = (Allocator *)lexer;
  }
  else {
    *errorPos = ctx.moduleRoot;
    if ((errorBuf != (char *)0x0) && (errorBufSize != 0)) {
      sVar4 = strlen(errorBuf);
      bytecode._4_4_ = (int)sVar4;
      NULLC::SafeSprintf(errorBuf + (sVar4 & 0xffffffff),(ulong)(errorBufSize - bytecode._4_4_),
                         " [in module \'%s\']",modulePath);
    }
    allocator_local = (Allocator *)0x0;
  }
  bytecode._0_4_ = 1;
  CompilerContext::~CompilerContext((CompilerContext *)local_a8b0);
  NULLC::TraceScope::~TraceScope((TraceScope *)&ctx.statistics.timers.allocator);
  return (char *)allocator_local;
}

Assistant:

char* BuildModuleFromSource(Allocator *allocator, const char *modulePath, const char *moduleRoot, const char *code, unsigned codeSize, const char **errorPos, char *errorBuf, unsigned errorBufSize, int optimizationLevel, ArrayView<InplaceStr> activeImports, CompilerStatistics *statistics)
{
	TRACE_SCOPE("compiler", "BuildModuleFromSource");
	TRACE_LABEL(modulePath);

	CompilerContext ctx(allocator, optimizationLevel, activeImports);

	ctx.errorBuf = errorBuf;
	ctx.errorBufSize = errorBufSize;

	ctx.code = code;
	ctx.moduleRoot = moduleRoot;

	if(!CompileModuleFromSource(ctx))
	{
		*errorPos = ctx.errorPos;

		if(errorBuf && errorBufSize)
		{
			unsigned currLen = (unsigned)strlen(errorBuf);
			NULLC::SafeSprintf(errorBuf + currLen, errorBufSize - currLen, " [in module '%s']", modulePath);
		}

		return NULL;
	}

	ctx.statistics.Start(NULLCTime::clockMicro());

	char *bytecode = NULL;
	GetBytecode(ctx, &bytecode);

	ctx.statistics.Finish("Bytecode", NULLCTime::clockMicro());

	ctx.statistics.Start(NULLCTime::clockMicro());

	Lexer &lexer = ctx.parseCtx.lexer;

	const char *newStart = FindSource((ByteCode*)bytecode);

	// We have to fix lexeme positions to the code that is saved in bytecode
	for(Lexeme *c = lexer.GetStreamStart(), *e = lexer.GetStreamStart() + lexer.GetStreamSize(); c != e; c++)
	{
		// Exit fix up if lexemes exited scope of the current file
		if(c->pos < code || c->pos > (code + codeSize))
			break;

		c->pos = newStart + (c->pos - code);
	}

	BinaryCache::PutBytecode(modulePath, bytecode, lexer.GetStreamStart(), lexer.GetStreamSize());

	ctx.statistics.Finish("BytecodeCache", NULLCTime::clockMicro());

	if(statistics)
		statistics->Add(ctx.statistics);

	return bytecode;
}